

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text.c
# Opt level: O2

void al_draw_textf(ALLEGRO_FONT *font,ALLEGRO_COLOR color,float x,float y,int flags,char *format,...
                  )

{
  char in_AL;
  undefined8 uVar1;
  char *pcVar2;
  undefined8 in_RCX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list ap;
  undefined1 local_d8 [24];
  char *local_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  
  pcVar2 = local_c0;
  if (in_AL != '\0') {
    local_68 = in_XMM4_Qa;
    local_58 = in_XMM5_Qa;
    local_48 = in_XMM6_Qa;
    local_38 = in_XMM7_Qa;
  }
  local_c0 = (char *)in_RCX;
  local_b8 = in_R8;
  local_b0 = in_R9;
  if (((*format == '%') && (format[1] == 's')) && (format[2] == '\0')) {
    ap[0].reg_save_area = local_d8;
    ap[0].overflow_arg_area = &stack0x00000008;
    ap[0].gp_offset = 0x20;
    ap[0].fp_offset = 0x70;
    al_draw_text(font,color,x,y,flags,pcVar2);
  }
  else {
    ap[0].reg_save_area = local_d8;
    ap[0].overflow_arg_area = &stack0x00000008;
    ap[0].gp_offset = 0x18;
    ap[0].fp_offset = 0x70;
    uVar1 = al_ustr_new("");
    al_ustr_vappendf(uVar1,format,ap);
    pcVar2 = (char *)al_cstr(uVar1);
    al_draw_text(font,color,x,y,flags,pcVar2);
    al_ustr_free(uVar1);
  }
  return;
}

Assistant:

void al_draw_textf(const ALLEGRO_FONT *font, ALLEGRO_COLOR color,
   float x, float y, int flags,
   const char *format, ...)
{
   ALLEGRO_USTR *buf;
   va_list ap;
   const char *s;
   ASSERT(font);
   ASSERT(format);

   /* Fast path for common case. */
   if (0 == strcmp(format, "%s")) {
      va_start(ap, format);
      s = va_arg(ap, const char *);
      al_draw_text(font, color, x, y, flags, s);
      va_end(ap);
      return;
   }

   va_start(ap, format);
   buf = al_ustr_new("");
   al_ustr_vappendf(buf, format, ap);
   va_end(ap);

   al_draw_text(font, color, x, y, flags, al_cstr(buf));

   al_ustr_free(buf);
}